

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_24c00e3::entry_to_remove::remove_self
          (entry_to_remove *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *entries)

{
  size_t __n;
  pointer pbVar1;
  pointer pbVar2;
  pointer __s2;
  int iVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar6;
  
  lVar5 = this->count;
  __n = (this->value)._M_string_length;
  if (__n == 0 || lVar5 < 1) {
    return;
  }
  pbVar1 = (entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    lVar4 = 0;
  }
  else {
    __s2 = (this->value)._M_dataplus._M_p;
    lVar4 = 0;
    pbVar6 = pbVar1;
    do {
      if (((pbVar6->_M_string_length == __n) &&
          (iVar3 = bcmp((pbVar6->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)) &&
         (lVar5 = lVar5 + -1, lVar5 == 0)) break;
      lVar4 = lVar4 + 1;
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(entries,pbVar1 + lVar4);
  return;
}

Assistant:

void remove_self(std::vector<std::string>& entries) const
  {
    if (this->valid()) {
      long to_skip = this->count;
      long index_to_remove = 0;
      for (const auto& path : entries) {
        if (path == this->value && --to_skip == 0) {
          break;
        }
        ++index_to_remove;
      }
      entries.erase(entries.begin() + index_to_remove);
    }
  }